

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall
cmFindPackageCommand::CheckPackageRegistryEntry
          (cmFindPackageCommand *this,string *fname,cmSearchPath *outPaths)

{
  cmSearchPath *this_00;
  bool bVar1;
  char *pcVar2;
  string local_48;
  cmSearchPath *local_28;
  cmSearchPath *outPaths_local;
  string *fname_local;
  cmFindPackageCommand *this_local;
  
  local_28 = outPaths;
  outPaths_local = (cmSearchPath *)fname;
  fname_local = (string *)this;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileIsFullPath(pcVar2);
  if (bVar1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileExists(pcVar2);
    if (bVar1) {
      bVar1 = cmsys::SystemTools::FileIsDirectory((string *)outPaths_local);
      this_00 = local_28;
      if (bVar1) {
        cmSearchPath::AddPath(local_28,(string *)outPaths_local);
      }
      else {
        cmsys::SystemTools::GetFilenamePath(&local_48,(string *)outPaths_local);
        cmSearchPath::AddPath(this_00,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmFindPackageCommand::CheckPackageRegistryEntry(const std::string& fname,
                                                     cmSearchPath& outPaths)
{
  // Parse the content of one package registry entry.
  if (cmSystemTools::FileIsFullPath(fname.c_str())) {
    // The first line in the stream is the full path to a file or
    // directory containing the package.
    if (cmSystemTools::FileExists(fname.c_str())) {
      // The path exists.  Look for the package here.
      if (!cmSystemTools::FileIsDirectory(fname)) {
        outPaths.AddPath(cmSystemTools::GetFilenamePath(fname));
      } else {
        outPaths.AddPath(fname);
      }
      return true;
    }
    // The path does not exist.  Assume the stream content is
    // associated with an old package that no longer exists, and
    // delete it to keep the package registry clean.
    return false;
  }
  // The first line in the stream is not the full path to a file or
  // directory.  Assume the stream content was created by a future
  // version of CMake that uses a different format, and leave it.
  return true;
}